

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O1

IterateResult __thiscall
glcts::GeometryShaderIncompleteProgramObjectsTest::iterate
          (GeometryShaderIncompleteProgramObjectsTest *this)

{
  ostringstream *this_00;
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  ulong uVar6;
  NotSupportedError *this_01;
  ulong uVar7;
  qpTestResult testResult;
  bool *pbVar8;
  char *pcVar9;
  TestContext *this_02;
  pointer p_Var10;
  uint uVar11;
  GLint link_status;
  int local_1b4;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar5;
  
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
               ,0xb2);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  initTestRuns(this);
  initShaderObjects(this);
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  p_Var10 = (this->m_test_runs).
            super__Vector_base<glcts::GeometryShaderIncompleteProgramObjectsTest::_run,_std::allocator<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_test_runs).
      super__Vector_base<glcts::GeometryShaderIncompleteProgramObjectsTest::_run,_std::allocator<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>_>
      ._M_impl.super__Vector_impl_data._M_finish != p_Var10) {
    bVar1 = true;
    uVar11 = 1;
    uVar6 = 0;
    do {
      GVar3 = (**(code **)(lVar5 + 0x3c8))();
      this->m_po_id = GVar3;
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glCreateProgram() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                      ,0xc4);
      if (p_Var10[uVar6].use_separable_po == true) {
        (**(code **)(lVar5 + 0x1058))(this->m_po_id,0x8258,1);
        dVar4 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar4,"glProgramParameteri() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                        ,0xc9);
      }
      p_Var10 = p_Var10 + uVar6;
      if (p_Var10->use_fs == true) {
        (**(code **)(lVar5 + 0x10))(this->m_po_id,this->m_fs_id);
      }
      this_00 = (ostringstream *)(local_1b0 + 8);
      if (p_Var10->use_gs == true) {
        (**(code **)(lVar5 + 0x10))(this->m_po_id,this->m_gs_id);
      }
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glAttachShader() call(s) failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                      ,0xd6);
      (**(code **)(lVar5 + 0xce8))(this->m_po_id);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glLinkProgram() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                      ,0xda);
      local_1b4 = 0;
      (**(code **)(lVar5 + 0x9d8))(this->m_po_id,0x8b82,&local_1b4);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glGetProgramiv() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                      ,0xe0);
      if ((local_1b4 != 1) == p_Var10->use_separable_po) {
        local_1b0._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"Invalid link status reported for a ",0x23);
        pbVar8 = fixed_sample_locations_values + 1;
        if ((ulong)p_Var10->use_separable_po != 0) {
          pbVar8 = (bool *)0x1a70b71;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,pbVar8,(ulong)p_Var10->use_separable_po * 9);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00," program object, to which the following SOs were attached: ",
                   0x3b);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"FS:",3);
        pcVar9 = "NO";
        if ((ulong)p_Var10->use_fs != 0) {
          pcVar9 = "YES";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,pcVar9,(ulong)p_Var10->use_fs | 2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", GS:",5);
        pcVar9 = "NO";
        if ((ulong)p_Var10->use_gs != 0) {
          pcVar9 = "YES";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,pcVar9,(ulong)p_Var10->use_gs | 2);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_138);
        bVar1 = false;
      }
      (**(code **)(lVar5 + 0x448))(this->m_po_id);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glDeleteProgram() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                      ,0xf0);
      uVar6 = (ulong)uVar11;
      p_Var10 = (this->m_test_runs).
                super__Vector_base<glcts::GeometryShaderIncompleteProgramObjectsTest::_run,_std::allocator<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = ((long)(this->m_test_runs).
                     super__Vector_base<glcts::GeometryShaderIncompleteProgramObjectsTest::_run,_std::allocator<glcts::GeometryShaderIncompleteProgramObjectsTest::_run>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)p_Var10) *
              -0x5555555555555555;
      uVar11 = uVar11 + 1;
    } while (uVar6 <= uVar7 && uVar7 - uVar6 != 0);
    if (!bVar1) {
      this_02 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
      pcVar9 = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
      goto LAB_00d1273d;
    }
  }
  this_02 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
  pcVar9 = "Pass";
  testResult = QP_TEST_RESULT_PASS;
LAB_00d1273d:
  tcu::TestContext::setTestResult(this_02,testResult,pcVar9);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderIncompleteProgramObjectsTest::iterate()
{
	bool result = true;

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Initialize test runs */
	initTestRuns();

	/* Set up shader objects */
	initShaderObjects();

	/* Iterate over the test run set */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	for (unsigned int run_index = 0; run_index < m_test_runs.size(); ++run_index)
	{
		const _run& current_run = m_test_runs[run_index];

		/* Set up a program object */
		m_po_id = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed");

		if (current_run.use_separable_po)
		{
			gl.programParameteri(m_po_id, GL_PROGRAM_SEPARABLE, GL_TRUE);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glProgramParameteri() call failed");
		} /* if (current_run.use_separable_po) */

		if (current_run.use_fs)
		{
			gl.attachShader(m_po_id, m_fs_id);
		}

		if (current_run.use_gs)
		{
			gl.attachShader(m_po_id, m_gs_id);
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call(s) failed");

		/* Try to link the PO */
		gl.linkProgram(m_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

		/* Verify the link status */
		glw::GLint link_status = GL_FALSE;

		gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed");

		if ((current_run.use_separable_po && link_status != GL_TRUE) ||
			(!current_run.use_separable_po && link_status == GL_TRUE))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Invalid link status reported for a "
							   << ((current_run.use_separable_po) ? "separable" : "")
							   << " program object, to which the following SOs were attached: "
							   << "FS:" << ((current_run.use_fs) ? "YES" : "NO")
							   << ", GS:" << ((current_run.use_gs) ? "YES" : "NO") << tcu::TestLog::EndMessage;

			result = false;
		}

		/* Clean up for the next iteration */
		gl.deleteProgram(m_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteProgram() call failed");
	} /* for (all test runs) */

	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}